

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

void testing::internal::
     GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>
               (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *param_1,
               DefaultNameGenerator *param_2,int param_3)

{
  string local_40;
  
  DefaultNameGenerator::
  GetName<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
            (&local_40,param_2,param_3);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(param_1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>
            (param_1,(int)param_2 + 1);
  return;
}

Assistant:

void GenerateNamesRecursively(Types, std::vector<std::string>* result, int i) {
  result->push_back(NameGenerator::template GetName<typename Types::Head>(i));
  GenerateNamesRecursively<NameGenerator>(typename Types::Tail(), result,
                                          i + 1);
}